

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::HasInteriorVertexTopology(ON_SubDVertex *this)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->m_edge_count;
  bVar2 = false;
  if ((1 < (ulong)uVar1) && (uVar1 == this->m_face_count)) {
    bVar2 = false;
    if ((this->m_edges != (ON_SubDEdgePtr *)0x0) &&
       (bVar2 = false, this->m_faces != (ON_SubDFace **)0x0)) {
      uVar3 = 0;
      do {
        uVar4 = this->m_edges[uVar3].m_ptr & 0xfffffffffffffff8;
        if ((uVar4 == 0) || (*(short *)(uVar4 + 100) != 2)) {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool ON_SubDVertex::HasInteriorVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count && nullptr != m_edges && nullptr != m_faces)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        return false;
    }
    return true;
  }    
  return false;
}